

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

TestTextureCubeSp __thiscall
vkt::texture::util::loadTextureCube
          (util *this,Archive *archive,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  TestTextureCube *pTVar6;
  TestError *pTVar7;
  SharedPtrStateBase *extraout_RDX;
  pointer_____offset_0x10___ *ppuVar8;
  long lVar9;
  TestTextureCubeSp TVar10;
  TextureLevel level;
  TextureFormat commonFormat;
  TextureFormat uncompressedFormat;
  PixelBufferAccess decompressedBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commonFromatData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedData;
  string ext;
  PixelBufferAccess commonFormatBuffer;
  SharedPtr<vkt::pipeline::TestTextureCube> local_58 [2];
  
  pbVar1 = (filenames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(filenames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5;
  if ((int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % 6) != 0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"(int)filenames.size() % tcu::CUBEFACE_LAST == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x6a9);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::__cxx11::string::string((string *)&level,(string *)pbVar1);
  de::FilePath::getFileExtension_abi_cxx11_(&ext,(FilePath *)&level);
  std::__cxx11::string::~string((string *)&level);
  bVar3 = std::operator==(&ext,"png");
  if (bVar3) {
    lVar9 = 0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      tcu::TextureLevel::TextureLevel(&level);
      tcu::ImageIO::loadImage
                (&level,archive,
                 *(char **)((long)&(((filenames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar9));
      iVar4 = level.m_size.m_data[0];
      if ((level.m_format.type != UNORM_INT8) || (1 < level.m_format.order - RGB)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  ((InternalError *)pTVar7,(char *)0x0,
                   "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                   ,0x6b9);
        ppuVar8 = &tcu::InternalError::typeinfo;
LAB_00775729:
        __cxa_throw(pTVar7,ppuVar8,tcu::Exception::~Exception);
      }
      if (level.m_size.m_data[0] != level.m_size.m_data[1]) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"level.getWidth() == level.getHeight()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                   ,0x6bb);
        ppuVar8 = &tcu::TestError::typeinfo;
        goto LAB_00775729;
      }
      if (uVar5 == 0) {
        pTVar6 = (TestTextureCube *)operator_new(0x188);
        commonFormatBuffer.super_ConstPixelBufferAccess.m_format.order = RGBA;
        commonFormatBuffer.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
        vkt::pipeline::TestTextureCube::TestTextureCube
                  (pTVar6,(TextureFormat *)&commonFormatBuffer,iVar4);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)&decompressedBuffer,pTVar6);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::operator=
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)this,
                   (SharedPtr<vkt::pipeline::TestTextureCube> *)&decompressedBuffer);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::release
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)&decompressedBuffer);
      }
      uVar2 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      (**(code **)(**(long **)this + 0x38))
                (&decompressedBuffer,*(long **)this,(long)uVar2 / 6 & 0xffffffff,
                 (long)uVar2 % 6 & 0xffffffff);
      tcu::TextureLevel::getAccess(&commonFormatBuffer,&level);
      tcu::copy((EVP_PKEY_CTX *)&decompressedBuffer,(EVP_PKEY_CTX *)&commonFormatBuffer);
      tcu::TextureLevel::~TextureLevel(&level);
      lVar9 = lVar9 + 0x20;
    }
  }
  else {
    bVar3 = std::operator==(&ext,"pkm");
    if (!bVar3) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x6e0);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar9 = 0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      tcu::CompressedTexture::CompressedTexture((CompressedTexture *)&level);
      tcu::ImageIO::loadPKM
                ((CompressedTexture *)&level,archive,
                 *(char **)((long)&(((filenames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar9));
      if (level.m_format.type != level.m_size.m_data[0]) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"level.getWidth() == level.getHeight()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                   ,0x6cc);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uncompressedFormat = tcu::getUncompressedFormat(level.m_format.order);
      iVar4 = tcu::TextureFormat::getPixelSize(&uncompressedFormat);
      decompressedBuffer.super_ConstPixelBufferAccess.m_format.order._0_1_ = R;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&uncompressedData,(long)(int)(iVar4 * level.m_format.type * level.m_size.m_data[0])
                 ,(value_type_conflict5 *)&decompressedBuffer,(allocator_type *)&commonFormatBuffer)
      ;
      tcu::PixelBufferAccess::PixelBufferAccess
                (&decompressedBuffer,&uncompressedFormat,level.m_format.type,level.m_size.m_data[0],
                 1,uncompressedData.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      commonFormat.order = RGBA;
      commonFormat.type = UNORM_INT8;
      iVar4 = tcu::TextureFormat::getPixelSize(&commonFormat);
      commonFormatBuffer.super_ConstPixelBufferAccess.m_format =
           (TextureFormat)
           ((ulong)commonFormatBuffer.super_ConstPixelBufferAccess.m_format & 0xffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&commonFromatData,(long)(int)(iVar4 * level.m_format.type * level.m_size.m_data[0])
                 ,(value_type_conflict5 *)&commonFormatBuffer,(allocator_type *)local_58);
      tcu::PixelBufferAccess::PixelBufferAccess
                (&commonFormatBuffer,&commonFormat,level.m_format.type,level.m_size.m_data[0],1,
                 commonFromatData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      if (uVar5 == 0) {
        pTVar6 = (TestTextureCube *)operator_new(0x188);
        vkt::pipeline::TestTextureCube::TestTextureCube(pTVar6,&commonFormat,level.m_format.type);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr(local_58,pTVar6);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::operator=
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)this,local_58);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::release(local_58);
      }
      local_58[0].m_ptr._0_4_ = 0;
      tcu::CompressedTexture::decompress
                ((CompressedTexture *)&level,&decompressedBuffer,(TexDecompressionParams *)local_58)
      ;
      tcu::copy((EVP_PKEY_CTX *)&commonFormatBuffer,(EVP_PKEY_CTX *)&decompressedBuffer);
      uVar2 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      (**(code **)(**(long **)this + 0x38))
                (local_58,*(long **)this,(long)uVar2 / 6 & 0xffffffff,(long)uVar2 % 6 & 0xffffffff);
      tcu::copy((EVP_PKEY_CTX *)local_58,(EVP_PKEY_CTX *)&commonFormatBuffer);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&commonFromatData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&uncompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)&level);
      lVar9 = lVar9 + 0x20;
    }
  }
  std::__cxx11::string::~string((string *)&ext);
  TVar10.m_state = extraout_RDX;
  TVar10.m_ptr = (TestTextureCube *)this;
  return TVar10;
}

Assistant:

TestTextureCubeSp loadTextureCube (const tcu::Archive& archive, const std::vector<std::string>& filenames)
{
	DE_ASSERT(filenames.size() > 0);
	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	TCU_CHECK((int)filenames.size() % tcu::CUBEFACE_LAST == 0);

	TestTextureCubeSp texture;

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	if (ext == "png")
	{

		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			tcu::TextureLevel level;

			tcu::ImageIO::loadImage(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
											   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

			TCU_CHECK( level.getWidth() == level.getHeight());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), level.getWidth()));

			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), level.getAccess());
		}
	}
	else if (ext == "pkm")
	{
		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			// Compressed texture.
			tcu::CompressedTexture	level;

			tcu::ImageIO::loadPKM(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK( level.getWidth() == level.getHeight());

			tcu::TextureFormat		uncompressedFormat				= tcu::getUncompressedFormat(level.getFormat());
			std::vector<deUint8>	uncompressedData				(uncompressedFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	decompressedBuffer				(uncompressedFormat, level.getWidth(), level.getHeight(), 1, uncompressedData.data());

			tcu::TextureFormat		commonFormat					= tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
			std::vector<deUint8>	commonFromatData				(commonFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	commonFormatBuffer				(commonFormat, level.getWidth(), level.getHeight(), 1, commonFromatData.data());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(commonFormat, level.getWidth()));

			level.decompress(decompressedBuffer, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));

			tcu::copy(commonFormatBuffer, decompressedBuffer);
			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), commonFormatBuffer);
		}
	}
	else
		TCU_FAIL("Unsupported file format");

	return texture;
}